

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::read
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __nbytes)

{
  slot_type ptVar1;
  ssize_t sVar2;
  spinlock *this_00;
  undefined4 in_register_00000034;
  size_t in_R8;
  iterator it;
  iterator local_88;
  iterator local_58;
  
  StackTrace::set_read_write
            ((StackTrace *)(CONCAT44(in_register_00000034,__fd) + 0x38),__nbytes,(size_t)__buf);
  ipc::spinlock::lock(&this->vars_spl);
  local_58.inner_ = (Inner *)__nbytes;
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  ::find<unsigned_long>
            (&local_88,
             (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
              *)&this->vars,(key_arg<unsigned_long> *)&local_58);
  if (local_88.inner_ == (Inner *)0x0) {
    create_var(&local_58,this,__nbytes,in_R8);
    local_88.it_end_.ctrl_ = local_58.it_end_.ctrl_;
    local_88.it_end_.field_1 = local_58.it_end_.field_1;
    local_88.it_.ctrl_ = local_58.it_.ctrl_;
    local_88.it_.field_1 = local_58.it_.field_1;
    local_88.inner_ = local_58.inner_;
    local_88.inner_end_ = local_58.inner_end_;
  }
  ptVar1 = *local_88.it_.field_1.slot_;
  (this->vars_spl)._locked._M_base._M_i = false;
  this_00 = &(ptVar1->second).lock;
  ipc::spinlock::lock(this_00);
  sVar2 = read(this,__fd,&ptVar1->second,__nbytes);
  (this_00->_locked)._M_base._M_i = false;
  return sVar2;
}

Assistant:

void read(tls_t tls, void* pc, void* addr, size_t size) final {
    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    thr->get_stackDepot().set_read_write((size_t)(addr),
                                         reinterpret_cast<size_t>(pc));
    VarState* var;
    {
      std::lock_guard<ipc::spinlock> exLockT(vars_spl);
      auto it = vars.find((size_t)(addr));
      if (it == vars.end()) {  // create new variable if new
#if MAKE_OUTPUT
        std::cout << "variable is read before written" << std::endl;  // warning
#endif
        it = create_var((size_t)(addr), size);
      }
      var = &(it->second);
    }
    std::lock_guard<ipc::spinlock> lg(var->lock);
    read(thr, var, (size_t)addr);
  }